

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QWidget * __thiscall
QItemDelegate::createEditor
          (QItemDelegate *this,QWidget *parent,QStyleOptionViewItem *param_2,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QItemEditorFactory *pQVar5;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  QWidget *this_00;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemDelegate).field_0x8;
  bVar2 = QModelIndex::isValid(index);
  if (bVar2) {
    pQVar5 = *(QItemEditorFactory **)(lVar1 + 0x78);
    if (pQVar5 == (QItemEditorFactory *)0x0) {
      pQVar5 = QItemEditorFactory::defaultFactory();
    }
    QModelIndex::data(&QStack_48,index,2);
    uVar3 = ::QVariant::typeId(&QStack_48);
    iVar4 = (*pQVar5->_vptr_QItemEditorFactory[2])(pQVar5,(ulong)uVar3,parent);
    this_00 = (QWidget *)CONCAT44(extraout_var,iVar4);
    ::QVariant::~QVariant(&QStack_48);
    if (this_00 != (QWidget *)0x0) {
      QWidget::setFocusPolicy(this_00,WheelFocus);
      goto LAB_005040cc;
    }
  }
  this_00 = (QWidget *)0x0;
LAB_005040cc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &,
                                     const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    if (!index.isValid())
        return nullptr;
    const QItemEditorFactory *factory = d->f;
    if (factory == nullptr)
        factory = QItemEditorFactory::defaultFactory();
    QWidget *w = factory->createEditor(index.data(Qt::EditRole).userType(), parent);
    if (w)
        w->setFocusPolicy(Qt::WheelFocus);
    return w;
}